

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O0

void __thiscall bwtil::IndexedBWT::loadFromFile(IndexedBWT *this,FILE *fp)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  unsigned_long *__ptr;
  uchar *puVar1;
  FILE *in_RSI;
  uint *in_RDI;
  ulint numBytes;
  succinct_bitvector *in_stack_fffffffffffffe38;
  succinct_bitvector *in_stack_fffffffffffffe40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe48;
  allocator_type *in_stack_fffffffffffffe50;
  allocator_type *__a;
  size_type in_stack_fffffffffffffe58;
  undefined1 *puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  FILE *fp_00;
  uint *width;
  FILE *in_stack_fffffffffffffea8;
  WaveletTree *in_stack_fffffffffffffeb0;
  allocator_type local_141 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_121 [2];
  undefined1 local_f0 [24];
  FILE *in_stack_ffffffffffffff28;
  succinct_bitvector *in_stack_ffffffffffffff30;
  undefined1 local_48 [48];
  size_t local_18;
  FILE *local_10;
  
  fp_00 = (FILE *)0x1;
  local_10 = in_RSI;
  local_18 = fread(in_RDI,4,1,in_RSI);
  local_18 = fread(in_RDI + 1,4,(size_t)fp_00,local_10);
  local_18 = fread(in_RDI + 4,8,(size_t)fp_00,local_10);
  local_18 = fread(in_RDI + 6,8,(size_t)fp_00,local_10);
  local_18 = fread(in_RDI + 8,8,(size_t)fp_00,local_10);
  local_18 = fread(in_RDI + 10,4,(size_t)fp_00,local_10);
  local_18 = fread(in_RDI + 2,8,(size_t)fp_00,local_10);
  puVar2 = local_48;
  WaveletTree::WaveletTree((WaveletTree *)0x170154);
  width = in_RDI + 0xc;
  WaveletTree::operator=
            ((WaveletTree *)in_stack_fffffffffffffe40,(WaveletTree *)in_stack_fffffffffffffe38);
  WaveletTree::~WaveletTree((WaveletTree *)0x170176);
  WaveletTree::loadFromFile(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  succinct_bitvector::succinct_bitvector(in_stack_fffffffffffffe40);
  succinct_bitvector::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  succinct_bitvector::~succinct_bitvector(in_stack_fffffffffffffe40);
  succinct_bitvector::loadFromFile(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  load_packed_view_from_file((size_t)width,(size_t)puVar2,fp_00);
  bv::internal::packed_view<std::vector>::operator=
            ((packed_view<std::vector> *)in_stack_fffffffffffffe40,
             (packed_view<std::vector> *)in_stack_fffffffffffffe38);
  bv::internal::packed_view<std::vector>::~packed_view((packed_view<std::vector> *)0x170216);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x170228);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (allocator_type *)in_stack_fffffffffffffe50);
  puVar2 = local_f0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x170276);
  this_00 = local_121;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x170288);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_00,(size_type)puVar2,in_stack_fffffffffffffe50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1702d6);
  __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)*in_RDI;
  __a = local_141;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1702f4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00,(size_type)puVar2,__a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a,__x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x170340);
  __ptr = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x170351);
  local_18 = fread(__ptr,8,0x100,local_10);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x170384);
  local_18 = fread(puVar1,1,0x100,local_10);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1703b7);
  fread(puVar1,1,(ulong)*in_RDI,local_10);
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&terminator_position, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&offrate, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&number_of_SA_pointers, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&w, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		bwt_wt =  WaveletTree();
		bwt_wt.loadFromFile(fp);

		marked_positions =  succinct_bitvector();
		marked_positions.loadFromFile(fp);
		text_pointers = load_packed_view_from_file(w, number_of_SA_pointers, fp);

		FIRST = vector<ulint>(256);
		remapping = vector<uchar>(256);
		inverse_remapping = vector<uchar>(sigma);

		numBytes = fread(FIRST.data(), sizeof(ulint), 256, fp);
		assert(numBytes>0);
		numBytes = fread(remapping.data(), sizeof(uchar), 256, fp);
		assert(numBytes>0);
		numBytes = fread(inverse_remapping.data(), sizeof(uchar), sigma, fp);
		assert(numBytes>0);

		numBytes++;//avoids "variable not used" warning

	}